

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_constant(CompilerGLSL *this,SPIRConstant *constant)

{
  undefined8 ts_1;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  bool inside_block_like_struct_scope;
  bool local_169;
  undefined1 local_158 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  undefined1 local_f8 [40];
  string *macro_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [36];
  uint32_t local_8c;
  uint32_t local_88 [5];
  uint32_t local_74;
  string local_70 [8];
  string name;
  TypedID<(spirv_cross::Types)3> local_4c;
  TypedID<(spirv_cross::Types)3> local_48;
  TypedID<(spirv_cross::Types)3> local_44;
  bool local_3d;
  TypedID<(spirv_cross::Types)0> local_3c;
  bool is_workgroup_size_constant;
  ID workgroup_size_id;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  SPIRType *type;
  SPIRConstant *constant_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).field_0xc);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  SpecializationConstant::SpecializationConstant(&wg_y);
  SpecializationConstant::SpecializationConstant(&wg_z);
  SpecializationConstant::SpecializationConstant((SpecializationConstant *)&stack0xffffffffffffffc8)
  ;
  uVar2 = Compiler::get_work_group_size_specialization_constants
                    (&this->super_Compiler,&wg_y,&wg_z,
                     (SpecializationConstant *)&stack0xffffffffffffffc8);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3c);
  if (uVar2 != uVar3) {
    TypedID<(spirv_cross::Types)3>::TypedID(&local_44,&(constant->super_IVariant).self);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_44);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
    local_169 = true;
    if (uVar2 != uVar3) {
      TypedID<(spirv_cross::Types)3>::TypedID(&local_48,&(constant->super_IVariant).self);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_48);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
      local_169 = true;
      if (uVar2 != uVar3) {
        TypedID<(spirv_cross::Types)3>::TypedID(&local_4c,&(constant->super_IVariant).self);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_4c);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&stack0xffffffffffffffc8);
        local_169 = uVar2 == uVar3;
      }
    }
    local_3d = local_169;
    if (((((this->options).vulkan_semantics & 1U) == 0) || (local_169 == false)) &&
       ((((this->options).vulkan_semantics & 1U) != 0 ||
        ((local_169 == false ||
         (bVar1 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                             DecorationSpecId), bVar1)))))) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
      add_resource_name(this,uVar2);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_70,this,(ulong)uVar2);
      local_74 = (constant->super_IVariant).self.id;
      bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_74,DecorationSpecId);
      inside_block_like_struct_scope = SUB81(constant,0);
      if (bVar1) {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          local_f8._32_8_ = &constant->specialization_constant_macro_name;
          statement<char_const(&)[9],std::__cxx11::string_const&>
                    (this,(char (*) [9])"#ifndef ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f8._32_8_);
          ts_1 = local_f8._32_8_;
          constant_expression_abi_cxx11_
                    ((CompilerGLSL *)local_f8,(SPIRConstant *)this,inside_block_like_struct_scope);
          statement<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                    (this,(char (*) [9])"#define ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
                     (char (*) [2])0x5b521c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
          ::std::__cxx11::string::~string((string *)local_f8);
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          if ((local_3d & 1U) == 0) {
            (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_118,this,pSVar4,local_70,0);
            statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                      (this,(char (*) [7])0x5bf82d,local_118,(char (*) [4])0x5cb349,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f8._32_8_,(char (*) [2])0x5b3b6f);
            ::std::__cxx11::string::~string((string *)local_118);
          }
        }
        else {
          local_8c = (constant->super_IVariant).self.id;
          local_88[0] = Compiler::get_decoration
                                  (&this->super_Compiler,(ID)local_8c,DecorationSpecId);
          (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_b0,this,pSVar4,local_70,0);
          constant_expression_abi_cxx11_
                    ((CompilerGLSL *)&macro_name,(SPIRConstant *)this,inside_block_like_struct_scope
                    );
          statement<char_const(&)[22],unsigned_int,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (this,(char (*) [22])"layout(constant_id = ",local_88,(char (*) [9])0x5bf82b,
                     local_b0,(char (*) [4])0x5cb349,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &macro_name,(char (*) [2])0x5b3b6f);
          ::std::__cxx11::string::~string((string *)&macro_name);
          ::std::__cxx11::string::~string((string *)local_b0);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_158 + 0x20,this,pSVar4,local_70,0);
        constant_expression_abi_cxx11_
                  ((CompilerGLSL *)local_158,(SPIRConstant *)this,inside_block_like_struct_scope);
        statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (this,(char (*) [7])0x5bf82d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_158 + 0x20),(char (*) [4])0x5cb349,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_158);
        ::std::__cxx11::string::~string((string *)(local_158 + 0x20));
      }
      ::std::__cxx11::string::~string(local_70);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_constant(const SPIRConstant &constant)
{
	auto &type = get<SPIRType>(constant.constant_type);

	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	// This specialization constant is implicitly declared by emitting layout() in;
	if (constant.self == workgroup_size_id)
		return;

	// These specialization constants are implicitly declared by emitting layout() in;
	// In legacy GLSL, we will still need to emit macros for these, so a layout() in; declaration
	// later can use macro overrides for work group size.
	bool is_workgroup_size_constant = ConstantID(constant.self) == wg_x.id || ConstantID(constant.self) == wg_y.id ||
	                                  ConstantID(constant.self) == wg_z.id;

	if (options.vulkan_semantics && is_workgroup_size_constant)
	{
		// Vulkan GLSL does not need to declare workgroup spec constants explicitly, it is handled in layout().
		return;
	}
	else if (!options.vulkan_semantics && is_workgroup_size_constant &&
	         !has_decoration(constant.self, DecorationSpecId))
	{
		// Only bother declaring a workgroup size if it is actually a specialization constant, because we need macros.
		return;
	}

	add_resource_name(constant.self);
	auto name = to_name(constant.self);

	// Only scalars have constant IDs.
	if (has_decoration(constant.self, DecorationSpecId))
	{
		if (options.vulkan_semantics)
		{
			statement("layout(constant_id = ", get_decoration(constant.self, DecorationSpecId), ") const ",
			          variable_decl(type, name), " = ", constant_expression(constant), ";");
		}
		else
		{
			const string &macro_name = constant.specialization_constant_macro_name;
			statement("#ifndef ", macro_name);
			statement("#define ", macro_name, " ", constant_expression(constant));
			statement("#endif");

			// For workgroup size constants, only emit the macros.
			if (!is_workgroup_size_constant)
				statement("const ", variable_decl(type, name), " = ", macro_name, ";");
		}
	}
	else
	{
		statement("const ", variable_decl(type, name), " = ", constant_expression(constant), ";");
	}
}